

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O3

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetISO8601
          (TimeZoneFormat *this,UnicodeString *text,ParsePosition *pos,UBool extendedOnly,
          UBool *hasDigitOffset)

{
  short sVar1;
  char16_t cVar2;
  uint uVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  char16_t *pcVar7;
  uint uVar8;
  ParsePosition posOffset;
  ParsePosition posBasic;
  int local_60;
  ParsePosition local_58;
  _func_int **local_48;
  ParsePosition local_40;
  
  if (hasDigitOffset != (UBool *)0x0) {
    *hasDigitOffset = '\0';
  }
  uVar3 = pos->index;
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar8 = (text->fUnion).fFields.fLength;
  }
  else {
    uVar8 = (int)sVar1 >> 5;
  }
  if (((int)uVar8 <= (int)uVar3) || (uVar8 <= uVar3)) {
LAB_001fdb9f:
    pos->errorIndex = uVar3;
    return 0;
  }
  if (((int)sVar1 & 2U) == 0) {
    pcVar7 = (text->fUnion).fFields.fArray;
  }
  else {
    pcVar7 = (char16_t *)((long)&text->fUnion + 2);
  }
  cVar2 = pcVar7[(int)uVar3];
  if ((cVar2 & 0xffdfU) == 0x5a) {
    pos->index = uVar3 + 1;
    return 0;
  }
  if (cVar2 == L'+') {
    local_60 = 1;
  }
  else {
    if (cVar2 != L'-') goto LAB_001fdb9f;
    local_60 = -1;
  }
  local_48 = (_func_int **)&PTR__ParsePosition_003da088;
  local_58.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003da088;
  local_58.errorIndex = -1;
  local_58.index = uVar3 + 1;
  iVar5 = parseAsciiOffsetFields(text,&local_58,L':',FIELDS_H,FIELDS_HMS);
  iVar4 = local_58.index;
  if (extendedOnly == '\0' && local_58.errorIndex == -1) {
    if ((int)(local_58.index - uVar3) < 4) {
      local_40.super_UObject._vptr_UObject = local_48;
      local_40.errorIndex = -1;
      local_40.index = uVar3 + 1;
      iVar6 = parseAbuttingAsciiOffsetFields(text,&local_40,FIELDS_H,FIELDS_HMS,'\0');
      if ((local_40.errorIndex == -1) && (iVar4 < local_40.index)) {
        local_58.index = local_40.index;
        iVar5 = iVar6;
      }
      ParsePosition::~ParsePosition(&local_40);
    }
  }
  else if (local_58.errorIndex != -1) {
    pos->errorIndex = uVar3;
    iVar5 = 0;
    goto LAB_001fdc9c;
  }
  pos->index = local_58.index;
  if (hasDigitOffset != (UBool *)0x0) {
    *hasDigitOffset = '\x01';
  }
  iVar5 = iVar5 * local_60;
LAB_001fdc9c:
  ParsePosition::~ParsePosition(&local_58);
  return iVar5;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetISO8601(const UnicodeString& text, ParsePosition& pos, UBool extendedOnly, UBool* hasDigitOffset /* = NULL */) const {
    if (hasDigitOffset) {
        *hasDigitOffset = FALSE;
    }
    int32_t start = pos.getIndex();
    if (start >= text.length()) {
        pos.setErrorIndex(start);
        return 0;
    }

    UChar firstChar = text.charAt(start);
    if (firstChar == ISO8601_UTC || firstChar == (UChar)(ISO8601_UTC + 0x20)) {
        // "Z" (or "z") - indicates UTC
        pos.setIndex(start + 1);
        return 0;
    }

    int32_t sign = 1;
    if (firstChar == PLUS) {
        sign = 1;
    } else if (firstChar == MINUS) {
        sign = -1;
    } else {
        // Not an ISO 8601 offset string
        pos.setErrorIndex(start);
        return 0;
    }
    ParsePosition posOffset(start + 1);
    int32_t offset = parseAsciiOffsetFields(text, posOffset, ISO8601_SEP, FIELDS_H, FIELDS_HMS);
    if (posOffset.getErrorIndex() == -1 && !extendedOnly && (posOffset.getIndex() - start <= 3)) {
        // If the text is successfully parsed as extended format with the options above, it can be also parsed
        // as basic format. For example, "0230" can be parsed as offset 2:00 (only first digits are valid for
        // extended format), but it can be parsed as offset 2:30 with basic format. We use longer result.
        ParsePosition posBasic(start + 1);
        int32_t tmpOffset = parseAbuttingAsciiOffsetFields(text, posBasic, FIELDS_H, FIELDS_HMS, FALSE);
        if (posBasic.getErrorIndex() == -1 && posBasic.getIndex() > posOffset.getIndex()) {
            offset = tmpOffset;
            posOffset.setIndex(posBasic.getIndex());
        }
    }

    if (posOffset.getErrorIndex() != -1) {
        pos.setErrorIndex(start);
        return 0;
    }

    pos.setIndex(posOffset.getIndex());
    if (hasDigitOffset) {
        *hasDigitOffset = TRUE;
    }
    return sign * offset;
}